

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heterogeneous_queue_basic_tests.cpp
# Opt level: O3

void density_tests::
     SpQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::
     dynamic_push_3<density_tests::SingleDerived,density::sp_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
               (sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                *i_queue)

{
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  SingleDerived move_source;
  SingleDerived copy_source;
  runtime_type local_b8;
  undefined1 local_b0 [16];
  double local_a0;
  InstanceCounted local_98 [8];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  InstanceCounted local_70 [8];
  undefined1 local_68 [16];
  double local_58;
  InstanceCounted local_50 [8];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  InstanceCounted local_28 [8];
  
  local_b8.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::SingleDerived>
       ::s_table;
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::dyn_push(i_queue,&local_b8);
  local_68._8_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_68 + 0xc));
  local_68._0_8_ = &PTR_class_id_01067338;
  local_58 = 22.0;
  InstanceCounted::new_instance(local_50);
  local_48._M_p = (pointer)&local_38;
  local_68._0_8_ = &PTR_class_id_010673f8;
  local_38._M_allocated_capacity._0_4_ = 0x21216948;
  local_40 = 4;
  local_38._M_local_buf[4] = '\0';
  InstanceCounted::new_instance(local_28);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::dyn_push_copy(i_queue,&local_b8,local_68);
  local_b0._8_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_b0 + 0xc));
  local_b0._0_8_ = &PTR_class_id_01067338;
  local_a0 = 22.0;
  InstanceCounted::new_instance(local_98);
  local_90._M_p = (pointer)&local_80;
  local_b0._0_8_ = &PTR_class_id_010673f8;
  local_80._M_allocated_capacity._0_4_ = 0x21216948;
  local_88 = 4;
  local_80._M_local_buf[4] = '\0';
  InstanceCounted::new_instance(local_70);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::dyn_push_move(i_queue,&local_b8,local_b0);
  SingleDerived::~SingleDerived((SingleDerived *)local_b0);
  SingleDerived::~SingleDerived((SingleDerived *)local_68);
  return;
}

Assistant:

static void dynamic_push_3(QUEUE & i_queue)
        {
            auto const type = QUEUE::runtime_type::template make<ELEMENT>();

            i_queue.dyn_push(type);

            ELEMENT copy_source;
            i_queue.dyn_push_copy(type, &copy_source);

            ELEMENT move_source;
            i_queue.dyn_push_move(type, &move_source);
        }